

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  cmMakefile *pcVar1;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmLocalGenerator_cxx:262:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmLocalGenerator_cxx:262:5)>
  __comp_00;
  pointer __first;
  pointer __last;
  bool bVar2;
  long lVar3;
  cmValue cVar4;
  cmValue cVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  OutputFormat output;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string_view str;
  string_view source;
  string flags;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string sep;
  string frameworkDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  ostringstream includeFlags;
  _Alloc_hider local_2e8;
  size_t local_2e0;
  undefined1 local_2d8 [22];
  char local_2c2;
  char local_2c1;
  cmGlobalGenerator *local_2c0;
  _Alloc_hider local_2b8;
  undefined4 local_2b0;
  uint local_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  cmGeneratorTarget *local_298;
  _Base_ptr local_290;
  undefined1 local_288 [8];
  undefined1 auStack_280 [8];
  _Rb_tree_node_base local_278;
  string *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  long local_240 [2];
  undefined1 local_230 [32];
  _Base_ptr local_210;
  string *local_208;
  cmOutputConverter *local_200;
  _Base_ptr local_1f8;
  _Base_ptr local_1f0;
  string *local_1e8;
  string local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  ios_base local_138 [264];
  
  local_2c0 = (cmGlobalGenerator *)lang;
  local_290 = (_Base_ptr)config;
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,includeDirs);
    __last = local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __first = local_1c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2e8._M_p = (pointer)target;
    if (target != (cmGeneratorTarget *)0x0) {
      local_288 = (undefined1  [8])&local_2e8;
      auStack_280 = (undefined1  [8])local_290;
      local_278._0_8_ = local_2c0;
      if (local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar3 = (long)local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_1c0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
        if (local_198 == (_Base_ptr)0x0) {
          __comp_00._M_comp.config = (string *)auStack_280;
          __comp_00._M_comp.target = (cmGeneratorTarget **)local_288;
          __comp_00._M_comp.lang = (string *)local_278._0_8_;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,__comp_00);
        }
        else {
          __comp._M_comp.config = (string *)auStack_280;
          __comp._M_comp.target = (cmGeneratorTarget **)local_288;
          __comp._M_comp.lang = (string *)local_278._0_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_198,local_1a8._8_8_,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = this->Makefile;
    local_278._M_parent = (_Base_ptr)((_Alloc_hider *)&local_2c0->_vptr_cmGlobalGenerator)->_M_p;
    local_278._0_8_ = (local_2c0->TryCompileTimeout).__r;
    local_288 = (undefined1  [8])0x13;
    auStack_280 = (undefined1  [8])0x6dbae6;
    views._M_len = 2;
    views._M_array = (iterator)local_288;
    cmCatViews_abi_cxx11_((string *)&local_2e8,views);
    local_1f8 = (_Base_ptr)cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_2e8);
    if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
      operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
    }
    pcVar1 = this->Makefile;
    local_288 = (undefined1  [8])&local_278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_258 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_288);
    local_298 = target;
    if (local_288 != (undefined1  [8])&local_278) {
      operator_delete((void *)local_288,(ulong)(local_278._0_8_ + 1));
    }
    local_250._M_allocated_capacity = (size_type)local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250," ","");
    pcVar1 = this->Makefile;
    local_278._M_parent = (_Base_ptr)((_Alloc_hider *)&local_2c0->_vptr_cmGlobalGenerator)->_M_p;
    local_278._0_8_ = (local_2c0->TryCompileTimeout).__r;
    local_288 = (undefined1  [8])0x17;
    auStack_280 = (undefined1  [8])0x6dbb14;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_288;
    cmCatViews_abi_cxx11_((string *)&local_2e8,views_00);
    local_1e8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)&local_2e8);
    if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
      operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
    }
    if (local_1e8 == (string *)0x0) {
      pcVar1 = this->Makefile;
      local_278._M_parent = (_Base_ptr)((_Alloc_hider *)&local_2c0->_vptr_cmGlobalGenerator)->_M_p;
      local_278._0_8_ = (local_2c0->TryCompileTimeout).__r;
      local_288 = (undefined1  [8])0x1a;
      auStack_280 = (undefined1  [8])0x6dbb2d;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_288;
      cmCatViews_abi_cxx11_((string *)&local_2e8,views_01);
      local_2a8._8_8_ = cmMakefile::GetDefinition(pcVar1,(string *)&local_2e8);
      if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
        operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
      }
      pcVar1 = this->Makefile;
      local_278._M_parent = (_Base_ptr)((_Alloc_hider *)&local_2c0->_vptr_cmGlobalGenerator)->_M_p;
      local_278._0_8_ = (local_2c0->TryCompileTimeout).__r;
      local_288 = (undefined1  [8])0x1b;
      auStack_280 = (undefined1  [8])0x6dbb2c;
      local_278._M_left = (_Base_ptr)0x8;
      local_278._M_right = (_Base_ptr)0x6fecb5;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_288;
      cmCatViews_abi_cxx11_((string *)&local_2e8,views_02);
      local_2a8._M_allocated_capacity =
           (size_type)cmMakefile::GetDefinition(pcVar1,(string *)&local_2e8);
      if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
        operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_250._M_local_buf);
      local_2a8._M_allocated_capacity = 0;
      local_2a8._8_8_ = (string *)0x0;
    }
    pcVar1 = this->Makefile;
    local_278._M_parent = (_Base_ptr)((_Alloc_hider *)&local_2c0->_vptr_cmGlobalGenerator)->_M_p;
    local_278._0_8_ = (local_2c0->TryCompileTimeout).__r;
    local_288 = (undefined1  [8])0x6;
    auStack_280 = (undefined1  [8])0x6e4e51;
    local_278._M_left = (_Base_ptr)0x16;
    local_278._M_right = (_Base_ptr)0x6dbb4f;
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_288;
    cmCatViews_abi_cxx11_((string *)&local_2e8,views_03);
    cVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&local_2e8);
    if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
      operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
    }
    pcVar1 = this->Makefile;
    local_278._M_parent = (_Base_ptr)((_Alloc_hider *)&local_2c0->_vptr_cmGlobalGenerator)->_M_p;
    local_278._0_8_ = (local_2c0->TryCompileTimeout).__r;
    local_288 = (undefined1  [8])0x6;
    auStack_280 = (undefined1  [8])0x6e4e51;
    local_278._M_left = (_Base_ptr)0x1d;
    local_278._M_right = (_Base_ptr)0x6dbb48;
    views_04._M_len = 3;
    views_04._M_array = (iterator)local_288;
    cmCatViews_abi_cxx11_((string *)&local_2e8,views_04);
    cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&local_2e8);
    local_208 = __return_storage_ptr__;
    if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
      operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
    }
    local_278._M_parent = (_Base_ptr)auStack_280;
    auStack_280 = (undefined1  [8])((ulong)auStack_280 & 0xffffffff00000000);
    local_278._0_8_ = (_Base_ptr)0x0;
    local_278._M_right = (_Base_ptr)0x0;
    local_2b8._M_p =
         (pointer)local_1c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_278._M_left = local_278._M_parent;
    if (local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      output = (uint)forResponseFile + (uint)forResponseFile * 2;
      local_2c2 = cVar5.Value != (string *)0x0 && local_298 != (cmGeneratorTarget *)0x0;
      local_200 = &this->super_cmOutputConverter;
      local_2c1 = (string *)local_2a8._8_8_ != (string *)0x0 &&
                  local_298 != (cmGeneratorTarget *)0x0;
      uVar8 = 0;
      local_2b0 = 0;
      local_210 = (_Base_ptr)cVar5;
      local_1f0 = (_Base_ptr)cVar4;
      do {
        if (((_Base_ptr)cVar4.Value == (_Base_ptr)0x0) ||
           (((_Base_ptr)cVar4.Value)->_M_parent == (_Base_ptr)0x0)) {
LAB_00200db8:
          if ((local_1e8 != (string *)0x0 & (byte)uVar8) == 0) {
            if (local_2c1 != '\0') {
              bVar2 = cmGeneratorTarget::IsSystemIncludeDirectory
                                (local_298,(string *)local_2b8._M_p,(string *)local_290,
                                 (string *)local_2c0);
              if (bVar2) {
                local_2b0 = (undefined4)CONCAT71((int7)((ulong)local_2a8._8_8_ >> 8),1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,*(char **)local_2a8._8_8_,
                           *(size_type *)(local_2a8._8_8_ + 8));
                goto LAB_00200e29;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,*(char **)local_1f8,(long)local_1f8->_M_parent);
          }
LAB_00200e29:
          uVar8 = (ulong)output;
          (*this->_vptr_cmLocalGenerator[0x11])((string *)&local_2e8,this,local_2b8._M_p,uVar8);
          uVar8 = uVar8 & 0xffffffffffffff00;
          if ((local_2e0 != 0 && local_258 != (string *)0x0) && (*local_2e8._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2e8._M_p,local_2e0);
          if (((local_258 != (string *)0x0) && (local_2e0 != 0)) && (*local_2e8._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_250._M_allocated_capacity,local_250._8_8_);
          if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
            operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
          }
          uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
        }
        else {
          local_2ac = (uint)uVar8;
          pcVar1 = this->Makefile;
          local_2e8._M_p = local_2d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"APPLE","");
          bVar2 = cmMakefile::IsOn(pcVar1,(string *)&local_2e8);
          if (bVar2) {
            bVar2 = cmSystemTools::IsPathToFramework((string *)local_2b8._M_p);
          }
          else {
            bVar2 = false;
          }
          if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
            operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
          }
          cVar4.Value = (string *)local_1f0;
          uVar8 = (ulong)local_2ac;
          if (bVar2 == false) goto LAB_00200db8;
          local_2e0 = *(size_t *)local_2b8._M_p;
          local_2e8._M_p = local_2b8._M_p[8];
          local_2d8._0_8_ = 4;
          local_2d8._8_8_ = "/../";
          views_05._M_len = 2;
          views_05._M_array = (iterator)&local_2e8;
          cmCatViews_abi_cxx11_(&local_1e0,views_05);
          cmsys::SystemTools::CollapseFullPath((string *)local_230,&local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,
                            (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
          }
          pVar9 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_288,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_230);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (local_2c2 == '\0') {
LAB_00200d09:
              p_Var7 = (_Base_ptr)cVar4.Value;
            }
            else {
              bVar2 = cmGeneratorTarget::IsSystemIncludeDirectory
                                (local_298,(string *)local_2b8._M_p,(string *)local_290,
                                 (string *)local_2c0);
              p_Var7 = local_210;
              if (!bVar2) goto LAB_00200d09;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,*(char **)p_Var7,(long)p_Var7->_M_parent);
            source._M_str = (char *)local_230._0_8_;
            source._M_len = local_230._8_8_;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      ((string *)&local_2e8,local_200,source,output);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2e8._M_p,local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
              operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
            }
          }
          if ((_Base_ptr)local_230._0_8_ != (_Base_ptr)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_,(ulong)(local_230._16_8_ + 1));
          }
          uVar8 = (ulong)local_2ac;
        }
        local_2b8._M_p = local_2b8._M_p + 0x20;
      } while ((pointer)local_2b8._M_p !=
               local_1c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      if (((byte)local_2b0 & (string *)local_2a8._M_allocated_capacity != (string *)0x0) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)local_2a8._M_allocated_capacity,
                   *(size_type *)(local_2a8._M_allocated_capacity + 8));
      }
    }
    std::__cxx11::stringbuf::str();
    __return_storage_ptr__ = local_208;
    if (((*(char *)local_250._M_allocated_capacity != ' ') && (local_2e0 != 0)) &&
       (local_2e8._M_p[local_2e0 - 1] == *(char *)local_250._M_allocated_capacity)) {
      local_2e8._M_p[local_2e0 - 1] = ' ';
    }
    str._M_str = local_2e8._M_p;
    str._M_len = local_2e0;
    cmTrimWhitespace_abi_cxx11_(local_208,str);
    if ((cmGeneratorTarget *)local_2e8._M_p != (cmGeneratorTarget *)local_2d8) {
      operator_delete(local_2e8._M_p,local_2d8._0_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288);
    if ((long *)local_250._M_allocated_capacity != local_240) {
      operator_delete((void *)local_250._M_allocated_capacity,local_240[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir =
        cmSystemTools::CollapseFullPath(cmStrCat(i, "/../"));
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}